

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void __thiscall Hair_WhiteFurnace_Test::TestBody(Hair_WhiteFurnace_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  char *in_R9;
  int i;
  uint64_t a;
  undefined1 auVar7 [16];
  float fVar8;
  Float FVar9;
  Float FVar10;
  float fVar11;
  ulong extraout_XMM0_Qb;
  ulong uVar15;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined4 uVar20;
  undefined4 uVar22;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  float beta_n;
  Vector3f wo;
  Vector3f wi;
  SampledSpectrum SVar23;
  SampledSpectrum f;
  SampledSpectrum sigma_a;
  SampledWavelengths lambda;
  SampledSpectrum local_a0;
  RNG rng;
  HairBxDF hair;
  undefined1 auVar16 [56];
  undefined1 auVar21 [56];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  fVar8 = pbrt::RNG::Uniform<float>(&rng);
  hair.gamma_o = pbrt::RNG::Uniform<float>(&rng);
  hair.h = fVar8;
  uVar15 = extraout_XMM0_Qb;
  wo = pbrt::SampleUniformSphere((Point2f *)&hair);
  for (fVar8 = 0.1; fVar8 < 1.0; fVar8 = fVar8 + 0.2) {
    for (beta_n = 0.1; beta_n < 1.0; beta_n = beta_n + 0.2) {
      uVar6 = 20000;
      if (beta_n < 0.5) {
        uVar6 = 100000;
      }
      auVar17 = ZEXT1664(ZEXT816(0) << 0x40);
      if (fVar8 < 0.5) {
        uVar6 = 100000;
      }
      for (a = 0; uVar6 != a; a = a + 1) {
        FVar9 = pbrt::RadicalInverse(0,a);
        pbrt::SampledWavelengths::SampleXYZ(&lambda,FVar9);
        FVar9 = pbrt::RadicalInverse(1,a);
        auVar12._0_8_ = (double)FVar9;
        auVar12._8_8_ = extraout_XMM0_Qb_00;
        auVar7 = vfmadd132sd_fma(auVar12,ZEXT816(0xbff0000000000000),ZEXT816(0x4000000000000000));
        uVar2 = vcmpsd_avx512f(auVar7,ZEXT816(0xbfeffffde7210be9),1);
        bVar3 = (bool)((byte)uVar2 & 1);
        auVar7 = vminsd_avx(ZEXT816(0x3feffffde7210be9),auVar7);
        pbrt::SampledSpectrum::SampledSpectrum(&sigma_a,0.0);
        pbrt::HairBxDF::HairBxDF
                  (&hair,(float)(double)((ulong)bVar3 * -0x4010000218def417 +
                                        (ulong)!bVar3 * auVar7._0_8_),1.55,&sigma_a,fVar8,beta_n,0.0
                  );
        FVar9 = pbrt::RadicalInverse(2,a);
        FVar10 = pbrt::RadicalInverse(3,a);
        uVar20 = 0;
        uVar22 = 0;
        f.values.values[1] = FVar10;
        f.values.values[0] = FVar9;
        wi = pbrt::SampleUniformSphere((Point2f *)&f);
        auVar21 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
        auVar16 = ZEXT856(uVar15);
        SVar23 = pbrt::HairBxDF::f(&hair,wo,wi,Radiance);
        auVar18._0_8_ = SVar23.values.values._8_8_;
        auVar18._8_56_ = auVar21;
        auVar13._0_8_ = SVar23.values.values._0_8_;
        auVar13._8_56_ = auVar16;
        local_a0.values.values = (array<float,_4>)vmovlhps_avx(auVar13._0_16_,auVar18._0_16_);
        auVar5._4_4_ = uVar20;
        auVar5._0_4_ = wi.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar5._8_4_ = 0;
        auVar5._12_4_ = uVar22;
        auVar4._8_4_ = 0x7fffffff;
        auVar4._0_8_ = 0x7fffffff7fffffff;
        auVar4._12_4_ = 0x7fffffff;
        auVar7 = vandps_avx512vl(auVar5,auVar4);
        auVar16 = ZEXT856(auVar7._8_8_);
        SVar23 = pbrt::SampledSpectrum::operator*(&local_a0,auVar7._0_4_);
        auVar19._0_8_ = SVar23.values.values._8_8_;
        auVar19._8_56_ = auVar21;
        auVar14._0_8_ = SVar23.values.values._0_8_;
        auVar14._8_56_ = auVar16;
        f.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,auVar19._0_16_);
        FVar9 = pbrt::SampledSpectrum::y(&f,&lambda);
        auVar17 = ZEXT464((uint)(auVar17._0_4_ + FVar9));
      }
      fVar11 = auVar17._0_4_ / ((float)uVar6 * 0.07957747);
      auVar7._0_8_ = (double)fVar11;
      auVar7._8_8_ = auVar17._8_8_;
      uVar2 = vcmppd_avx512vl(ZEXT816(0x3fee666666666666),auVar7,2);
      uVar1 = vcmppd_avx512vl(auVar7,ZEXT816(0x3ff0cccccccccccd),2);
      lambda.lambda.values[0]._0_1_ = (byte)uVar2 & 3 & (byte)uVar1 & 1;
      lambda.lambda.values[2] = 0.0;
      lambda.lambda.values[3] = 0.0;
      if (lambda.lambda.values[0]._0_1_ == 0) {
        testing::Message::Message((Message *)&sigma_a);
        std::ostream::operator<<((void *)(sigma_a.values.values._0_8_ + 0x10),fVar11);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&hair,(internal *)&lambda,
                   (AssertionResult *)"avg >= .95 && avg <= 1.05","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&f,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp"
                   ,0x2a3,(char *)CONCAT44(hair.gamma_o,hair.h));
        testing::internal::AssertHelper::operator=((AssertHelper *)&f,(Message *)&sigma_a);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&f);
        std::__cxx11::string::~string((string *)&hair);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&sigma_a);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)(lambda.lambda.values + 2));
    }
  }
  return;
}

Assistant:

TEST(Hair, WhiteFurnace) {
    RNG rng;
    Vector3f wo = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
    for (Float beta_m = .1; beta_m < 1; beta_m += .2) {
        for (Float beta_n = .1; beta_n < 1; beta_n += .2) {
            // Estimate reflected uniform incident radiance from hair
            Float ySum = 0;

            // More samples for the smooth case, since we're sampling blindly.
            int count = (beta_m < .5 || beta_n < .5) ? 100000 : 20000;

            for (int i = 0; i < count; ++i) {
                SampledWavelengths lambda =
                    SampledWavelengths::SampleXYZ(RadicalInverse(0, i));

                Float h = Clamp(-1 + 2. * RadicalInverse(1, i), -.999999, .999999);
                SampledSpectrum sigma_a(0.f);
                HairBxDF hair(h, 1.55, sigma_a, beta_m, beta_n, 0.f);
                Vector3f wi =
                    SampleUniformSphere({RadicalInverse(2, i), RadicalInverse(3, i)});

                SampledSpectrum f =
                    hair.f(wo, wi, TransportMode::Radiance) * AbsCosTheta(wi);
                ySum += f.y(lambda);
            }

            Float avg = ySum / (count * UniformSpherePDF());
            EXPECT_TRUE(avg >= .95 && avg <= 1.05) << avg;
        }
    }
}